

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

FilePath * de::FilePath::normalize(FilePath *__return_storage_ptr__,FilePath *path)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)path);
  normalize((FilePath *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::normalize (const FilePath& path)
{
	return FilePath(path).normalize();
}